

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O0

void reoProfileWidthStart2(reo_man *p)

{
  int local_20;
  int local_1c;
  int v;
  int i;
  reo_unit *pUnit;
  reo_man *p_local;
  
  for (local_1c = 0; local_1c <= p->nSupp; local_1c = local_1c + 1) {
    p->pPlanes[local_1c].statsWidth = 0;
  }
  for (local_20 = 0; local_20 <= p->nSupp; local_20 = local_20 + 1) {
    for (_v = p->pPlanes[local_20].pHead; _v != (reo_unit *)0x0; _v = _v->Next) {
      _v->TopRef = 30000;
      _v->Sign = 0;
    }
  }
  for (local_1c = 0; local_1c < p->nTops; local_1c = local_1c + 1) {
    *(undefined2 *)(((ulong)p->pTops[local_1c] & 0xfffffffffffffffe) + 2) = 0;
  }
  for (local_1c = 0; local_1c < p->nSupp; local_1c = local_1c + 1) {
    for (_v = p->pPlanes[local_1c].pHead; _v != (reo_unit *)0x0; _v = _v->Next) {
      if (local_1c + 1 < (int)_v->pE->TopRef) {
        _v->pE->TopRef = (short)local_1c + 1;
      }
      if (local_1c + 1 < (int)_v->pT->TopRef) {
        _v->pT->TopRef = (short)local_1c + 1;
      }
    }
  }
  for (local_1c = 0; local_1c < p->nSupp; local_1c = local_1c + 1) {
    reoProfileWidthVerifyLevel(p->pPlanes + local_1c,local_1c);
  }
  for (local_1c = 0; local_1c < p->nSupp; local_1c = local_1c + 1) {
    for (_v = p->pPlanes[local_1c].pHead; _v != (reo_unit *)0x0; _v = _v->Next) {
      for (local_20 = (int)_v->TopRef; local_20 <= _v->lev; local_20 = local_20 + 1) {
        p->pPlanes[local_20].statsWidth = p->pPlanes[local_20].statsWidth + 1;
      }
    }
  }
  for (_v = p->pPlanes[p->nSupp].pHead; _v != (reo_unit *)0x0; _v = _v->Next) {
    for (local_20 = (int)_v->TopRef; local_20 <= p->nSupp; local_20 = local_20 + 1) {
      p->pPlanes[local_20].statsWidth = p->pPlanes[local_20].statsWidth + 1;
    }
  }
  p->nWidthCur = 0;
  for (local_1c = 0; local_1c <= p->nSupp; local_1c = local_1c + 1) {
    p->pPlanes[local_1c].statsCost = (double)p->pPlanes[local_1c].statsWidth;
    p->nWidthCur = p->pPlanes[local_1c].statsWidth + p->nWidthCur;
  }
  p->nWidthBeg = p->nWidthCur;
  return;
}

Assistant:

void reoProfileWidthStart2( reo_man * p )
{
    reo_unit * pUnit;
    int i, v;

    // clean the profile
    for ( i = 0; i <= p->nSupp; i++ )
        p->pPlanes[i].statsWidth = 0;
    
    // clean the node structures
    for ( v = 0; v <= p->nSupp; v++ )
    for ( pUnit = p->pPlanes[v].pHead; pUnit; pUnit = pUnit->Next )
    {
        pUnit->TopRef = REO_TOPREF_UNDEF;
        pUnit->Sign   = 0;
    }

    // set the topref to the topmost nodes
    for ( i = 0; i < p->nTops; i++ )
        Unit_Regular(p->pTops[i])->TopRef = 0;

    // go through the non-constant nodes and set the topmost level of their cofactors
    for ( i = 0; i < p->nSupp; i++ )
        for ( pUnit = p->pPlanes[i].pHead; pUnit; pUnit = pUnit->Next )
        {
            if ( pUnit->pE->TopRef > i+1 )
                 pUnit->pE->TopRef = i+1;
            if ( pUnit->pT->TopRef > i+1 )
                 pUnit->pT->TopRef = i+1;
        }

    // verify the top reference
    for ( i = 0; i < p->nSupp; i++ )
        reoProfileWidthVerifyLevel( p->pPlanes + i, i );

    // compute the profile for the internal nodes
    for ( i = 0; i < p->nSupp; i++ )
        for ( pUnit = p->pPlanes[i].pHead; pUnit; pUnit = pUnit->Next )
            for ( v = pUnit->TopRef; v <= pUnit->lev; v++ )
                p->pPlanes[v].statsWidth++;

    // compute the profile for the constant nodes
    for ( pUnit = p->pPlanes[p->nSupp].pHead; pUnit; pUnit = pUnit->Next )
        for ( v = pUnit->TopRef; v <= p->nSupp; v++ )
            p->pPlanes[v].statsWidth++;

    // get the width cost
    p->nWidthCur = 0;
    for ( i = 0; i <= p->nSupp; i++ )
    {
        p->pPlanes[i].statsCost = p->pPlanes[i].statsWidth;
        p->nWidthCur           += p->pPlanes[i].statsWidth;
    }
    p->nWidthBeg = p->nWidthCur;
}